

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O3

vector<unsigned_long,_true> *
duckdb::ExpressionHeuristics::GetInitialOrder
          (vector<unsigned_long,_true> *__return_storage_ptr__,TableFilterSet *table_filters)

{
  iterator __position;
  unsigned_long *puVar1;
  type filter;
  idx_t iVar2;
  unsigned_long *puVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  long lVar9;
  _Rb_tree_header *p_Var10;
  size_t __n;
  unsigned_long *puVar11;
  unsigned_long *puVar12;
  ulong uVar13;
  bool bVar14;
  unsigned_long *local_50;
  
  p_Var4 = (table_filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(table_filters->filters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 == p_Var10) {
    local_50 = (unsigned_long *)0x0;
  }
  else {
    uVar7 = 0;
    local_50 = (unsigned_long *)0x0;
    puVar3 = (unsigned_long *)0x0;
    puVar12 = (unsigned_long *)0x0;
    do {
      filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&p_Var4[1]._M_parent);
      iVar2 = Cost(filter);
      if (puVar3 == puVar12) {
        __n = (long)puVar3 - (long)local_50;
        if (__n == 0x7ffffffffffffff0) {
          ::std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar13 = (long)__n >> 4;
        uVar8 = 1;
        if (puVar3 != local_50) {
          uVar8 = uVar13;
        }
        uVar5 = uVar8 + uVar13;
        if (0x7fffffffffffffe < uVar5) {
          uVar5 = 0x7ffffffffffffff;
        }
        uVar6 = 0x7ffffffffffffff;
        if (!CARRY8(uVar8,uVar13)) {
          uVar6 = uVar5;
        }
        if (uVar6 == 0) {
          puVar3 = (unsigned_long *)0x0;
        }
        else {
          puVar3 = (unsigned_long *)operator_new(uVar6 << 4);
        }
        puVar3[uVar13 * 2] = uVar7;
        puVar3[uVar13 * 2 + 1] = iVar2;
        if (0 < (long)__n) {
          memmove(puVar3,local_50,__n);
        }
        if (local_50 != (unsigned_long *)0x0) {
          operator_delete(local_50);
        }
        puVar11 = (unsigned_long *)(__n + (long)puVar3);
        puVar12 = puVar3 + uVar6 * 2;
        local_50 = puVar3;
      }
      else {
        *puVar3 = uVar7;
        puVar3[1] = iVar2;
        puVar11 = puVar3;
      }
      puVar3 = puVar11 + 2;
      uVar7 = uVar7 + 1;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var10);
    if (local_50 != puVar3) {
      uVar8 = (long)puVar3 - (long)local_50 >> 4;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_50,puVar3,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)puVar3 - (long)local_50 < 0x101) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_50,puVar3);
LAB_0068bd4d:
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        puVar12 = local_50 + 0x20;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_50,puVar12);
        if (puVar12 == puVar3) goto LAB_0068bd4d;
        do {
          uVar7 = *puVar12;
          uVar13 = puVar12[1];
          uVar5 = puVar12[-1];
          puVar1 = puVar12;
          while (uVar13 < uVar5) {
            *(int *)puVar1 = (int)puVar1[-2];
            *(undefined4 *)((long)puVar1 + 4) = *(undefined4 *)((long)puVar1 + -0xc);
            *(int *)(puVar1 + 1) = (int)puVar1[-1];
            *(undefined4 *)((long)puVar1 + 0xc) = *(undefined4 *)((long)puVar1 + -4);
            uVar5 = puVar1[-3];
            puVar1 = puVar1 + -2;
          }
          *puVar1 = uVar7;
          puVar1[1] = uVar13;
          bVar14 = puVar12 != puVar11;
          puVar12 = puVar12 + 2;
        } while (bVar14);
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_50 == puVar3) goto LAB_0068bd9f;
      }
      lVar9 = uVar8 + (uVar8 == 0);
      puVar3 = local_50;
      do {
        __position._M_current =
             (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                     __position,puVar3);
        }
        else {
          *__position._M_current = *puVar3;
          (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        puVar3 = puVar3 + 2;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      goto LAB_0068bd9f;
    }
  }
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
LAB_0068bd9f:
  if (local_50 != (unsigned_long *)0x0) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<idx_t> ExpressionHeuristics::GetInitialOrder(const TableFilterSet &table_filters) {
	struct FilterCost {
		idx_t index;
		idx_t cost;

		bool operator==(const FilterCost &p) const {
			return cost == p.cost;
		}
		bool operator<(const FilterCost &p) const {
			return cost < p.cost;
		}
	};
	vector<FilterCost> filter_costs;
	idx_t filter_index = 0;
	for (auto &entry : table_filters.filters) {
		FilterCost cost;
		cost.index = filter_index;
		cost.cost = Cost(*entry.second);
		filter_costs.push_back(cost);
		filter_index++;
	}
	// sort by cost and put back in place
	sort(filter_costs.begin(), filter_costs.end());
	vector<idx_t> initial_permutation;
	for (idx_t i = 0; i < filter_costs.size(); i++) {
		initial_permutation.push_back(filter_costs[i].index);
	}
	return initial_permutation;
}